

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void launch_test_thread<unsigned_short>
               (vector<std::thread,_std::allocator<std::thread>_> *test_threads)

{
  pointer ptVar1;
  pointer ptVar2;
  thread *t;
  pointer ptVar3;
  
  if (launch_test_thread<unsigned_short>(std::vector<std::thread,std::allocator<std::thread>>&)::
      max_threads == '\0') {
    launch_test_thread<unsigned_short>();
  }
  ptVar3 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)ptVar1 - (long)ptVar3 >> 3 == (ulong)launch_test_thread<unsigned_short>::max_threads) {
    for (; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
      std::thread::join();
    }
    ptVar3 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ptVar1 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar2 = ptVar3;
    if (ptVar1 != ptVar3) {
      do {
        if ((ptVar2->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar2 = ptVar2 + 1;
      } while (ptVar2 != ptVar1);
      (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
      super__Vector_impl_data._M_finish = ptVar3;
    }
  }
  std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
            ((vector<std::thread,std::allocator<std::thread>> *)test_threads,
             run_test<unsigned_short>);
  return;
}

Assistant:

void launch_test_thread(std::vector<std::thread> &test_threads) {
    static uint8_t max_threads = get_max_threads();

    if (max_threads == test_threads.size()) {
        wait_for_threads(test_threads);
        test_threads.clear();
    }
    test_threads.emplace_back(run_test<_IntT>);
}